

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatSolverAPI.c
# Opt level: O0

int xSAT_SolverSimplify(xSAT_Solver_t *s)

{
  xSAT_VecWatchList_t *pxVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  xSAT_Clause_t *pCla_00;
  xSAT_WatchList_t *pxVar5;
  xSAT_Clause_t *pCla;
  int local_20;
  uint CRef;
  int j;
  int i;
  xSAT_Solver_t *s_local;
  
  iVar2 = xSAT_SolverDecisionLevel(s);
  if (iVar2 == 0) {
    uVar3 = xSAT_SolverPropagate(s);
    if (uVar3 == 0xffffffff) {
      iVar2 = s->nAssignSimplify;
      iVar4 = Vec_IntSize(s->vTrail);
      if ((iVar2 == iVar4) || (0 < s->nPropSimplify)) {
        s_local._4_4_ = 1;
      }
      else {
        local_20 = 0;
        for (CRef = 0; iVar2 = Vec_IntSize(s->vClauses), (int)CRef < iVar2; CRef = CRef + 1) {
          uVar3 = Vec_IntEntry(s->vClauses,CRef);
          pCla_00 = xSAT_SolverReadClause(s,uVar3);
          iVar2 = xSAT_SolverIsClauseSatisfied(s,pCla_00);
          if (iVar2 == 0) {
            Vec_IntWriteEntry(s->vClauses,local_20,uVar3);
            local_20 = local_20 + 1;
          }
          else {
            *(uint *)pCla_00 = *(uint *)pCla_00 & 0xfffffffd | 2;
            (s->Stats).nClauseLits = (s->Stats).nClauseLits - (long)pCla_00->nSize;
            if (pCla_00->nSize == 2) {
              pxVar1 = s->vBinWatches;
              iVar2 = xSAT_NegLit(*(int *)(pCla_00 + 1));
              pxVar5 = xSAT_VecWatchListEntry(pxVar1,iVar2);
              xSAT_WatchListRemove(pxVar5,uVar3);
              pxVar1 = s->vBinWatches;
              iVar2 = xSAT_NegLit(pCla_00[1].nSize);
              pxVar5 = xSAT_VecWatchListEntry(pxVar1,iVar2);
              xSAT_WatchListRemove(pxVar5,uVar3);
            }
            else {
              pxVar1 = s->vWatches;
              iVar2 = xSAT_NegLit(*(int *)(pCla_00 + 1));
              pxVar5 = xSAT_VecWatchListEntry(pxVar1,iVar2);
              xSAT_WatchListRemove(pxVar5,uVar3);
              pxVar1 = s->vWatches;
              iVar2 = xSAT_NegLit(pCla_00[1].nSize);
              pxVar5 = xSAT_VecWatchListEntry(pxVar1,iVar2);
              xSAT_WatchListRemove(pxVar5,uVar3);
            }
          }
        }
        Vec_IntShrink(s->vClauses,local_20);
        xSAT_SolverRebuildOrderHeap(s);
        iVar2 = Vec_IntSize(s->vTrail);
        s->nAssignSimplify = iVar2;
        s->nPropSimplify = (s->Stats).nClauseLits + (s->Stats).nLearntLits;
        s_local._4_4_ = 1;
      }
    }
    else {
      s_local._4_4_ = 0;
    }
    return s_local._4_4_;
  }
  __assert_fail("xSAT_SolverDecisionLevel(s) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/xsat/xsatSolverAPI.c"
                ,0xa8,"int xSAT_SolverSimplify(xSAT_Solver_t *)");
}

Assistant:

int xSAT_SolverSimplify( xSAT_Solver_t * s )
{
    int i, j;
    unsigned CRef;
    assert( xSAT_SolverDecisionLevel(s) == 0 );

    if ( xSAT_SolverPropagate(s) != CRefUndef )
        return false;

    if ( s->nAssignSimplify == Vec_IntSize( s->vTrail ) || s->nPropSimplify > 0 )
        return true;

    j = 0;
    Vec_IntForEachEntry( s->vClauses, CRef, i )
    {
        xSAT_Clause_t * pCla = xSAT_SolverReadClause( s, CRef );
        if ( xSAT_SolverIsClauseSatisfied( s, pCla ) )
        {
            pCla->fMark = 1;
            s->Stats.nClauseLits -= pCla->nSize;

            if ( pCla->nSize == 2 )
            {
                xSAT_WatchListRemove( xSAT_VecWatchListEntry( s->vBinWatches, xSAT_NegLit(pCla->pData[0].Lit) ), CRef );
                xSAT_WatchListRemove( xSAT_VecWatchListEntry( s->vBinWatches, xSAT_NegLit(pCla->pData[1].Lit) ), CRef );
            }
            else
            {
                xSAT_WatchListRemove( xSAT_VecWatchListEntry( s->vWatches, xSAT_NegLit(pCla->pData[0].Lit) ), CRef );
                xSAT_WatchListRemove( xSAT_VecWatchListEntry( s->vWatches, xSAT_NegLit(pCla->pData[1].Lit) ), CRef );
            }
        }
        else
            Vec_IntWriteEntry( s->vClauses, j++, CRef );
    }
    Vec_IntShrink( s->vClauses, j );
    xSAT_SolverRebuildOrderHeap( s );

    s->nAssignSimplify = Vec_IntSize( s->vTrail );
    s->nPropSimplify = s->Stats.nClauseLits + s->Stats.nLearntLits;

    return true;
}